

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::Node::IsLeadingTrailingSpaces
          (Node *this,Compiler *compiler,CharCount *leftMinMatch,CharCount *rightMinMatch)

{
  _func_int **pp_Var1;
  long lVar2;
  long lVar3;
  _func_int *p_Var4;
  long lVar5;
  long lVar6;
  bool bVar7;
  CharSet<char16_t> *pCVar8;
  
  if (((((((this->tag == Alt) && ((compiler->program->flags & MultilineRegexFlag) == NoRegexFlags))
         && (pp_Var1 = this[1]._vptr_Node, *(short *)(pp_Var1 + 1) == 6)) &&
        (((lVar2 = *(long *)&this[1].tag, lVar2 != 0 &&
          (lVar3 = *(long *)(lVar2 + 0x38), *(short *)(lVar3 + 8) == 6)) &&
         ((*(long *)(lVar2 + 0x40) == 0 &&
          ((*(short *)(pp_Var1[7] + 8) == 1 && (p_Var4 = pp_Var1[8], p_Var4 != (_func_int *)0x0)))))
         ))) && ((lVar2 = *(long *)(p_Var4 + 0x38), *(short *)(lVar2 + 8) == 10 &&
                 (((*(long *)(p_Var4 + 0x40) == 0 &&
                   (lVar5 = *(long *)(lVar3 + 0x38), *(short *)(lVar5 + 8) == 10)) &&
                  (lVar3 = *(long *)(lVar3 + 0x40), lVar3 != 0)))))) &&
      (((*(short *)(*(long *)(lVar3 + 0x38) + 8) == 2 && (*(long *)(lVar3 + 0x40) == 0)) &&
       (((*(char *)(lVar2 + 0x4a) == '\x01' &&
         ((*(int *)(lVar2 + 0x44) == -1 &&
          (lVar3 = *(long *)(lVar2 + 0x38), *(short *)(lVar3 + 8) == 0xb)))) &&
        (*(char *)(lVar5 + 0x4a) == '\x01')))))) &&
     ((((*(int *)(lVar5 + 0x44) == -1 &&
        (lVar6 = *(long *)(lVar5 + 0x38), *(short *)(lVar6 + 8) == 0xb)) &&
       (*(char *)(lVar3 + 0x38) == '\0')) && (*(char *)(lVar6 + 0x38) == '\0')))) {
    *leftMinMatch = *(CharCount *)(lVar2 + 0x40);
    *rightMinMatch = *(CharCount *)(lVar5 + 0x40);
    pCVar8 = StandardChars<char16_t>::GetWhitespaceSet(compiler->standardChars);
    bVar7 = CharSet<char16_t>::IsEqualTo((CharSet<char16_t> *)(lVar3 + 0x40),pCVar8);
    if (bVar7) {
      pCVar8 = StandardChars<char16_t>::GetWhitespaceSet(compiler->standardChars);
      bVar7 = CharSet<char16_t>::IsEqualTo((CharSet<char16_t> *)(lVar6 + 0x40),pCVar8);
      return bVar7;
    }
  }
  return false;
}

Assistant:

bool Node::IsLeadingTrailingSpaces(Compiler& compiler, CharCount& leftMinMatch, CharCount& rightMinMatch) const
    {

        if (tag != Node::Alt)
            return false;

        if (compiler.program->flags & MultilineRegexFlag)
            return false;

        const AltNode* altNode = (const AltNode*)this;
        if (altNode->head->tag != Node::Concat ||
            altNode->tail == 0 ||
            altNode->tail->head->tag != Node::Concat ||
            altNode->tail->tail != 0)
            return false;

        const ConcatNode* left = (const ConcatNode*)altNode->head;
        const ConcatNode* right = (const ConcatNode*)altNode->tail->head;

        if (left->head->tag != Node::BOL ||
            left->tail == 0 ||
            left->tail->head->tag != Node::Loop ||
            left->tail->tail != 0)
            return false;

        if (right->head->tag != Node::Loop ||
            right->tail == 0 ||
            right->tail->head->tag != Node::EOL ||
            right->tail->tail != 0)
            return false;

        const LoopNode* leftLoop = (const LoopNode*)left->tail->head;
        const LoopNode* rightLoop = (const LoopNode*)right->head;

        if (!leftLoop->isGreedy ||
            leftLoop->repeats.upper != CharCountFlag ||
            leftLoop->body->tag != Node::MatchSet ||
            !rightLoop->isGreedy ||
            rightLoop->repeats.upper != CharCountFlag ||
            rightLoop->body->tag != Node::MatchSet)
            return false;

        const MatchSetNode* leftSet = (const MatchSetNode*)leftLoop->body;
        const MatchSetNode* rightSet = (const MatchSetNode*)rightLoop->body;

        if (leftSet->isNegation ||
            rightSet->isNegation)
            return false;

        leftMinMatch = leftLoop->repeats.lower;
        rightMinMatch = rightLoop->repeats.lower;

        return
            leftSet->set.IsEqualTo(*compiler.standardChars->GetWhitespaceSet()) &&
            rightSet->set.IsEqualTo(*compiler.standardChars->GetWhitespaceSet());
    }